

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O1

int mbedtls_chacha20_crypt
              (uchar *key,uchar *nonce,uint32_t counter,size_t data_len,uchar *input,uchar *output)

{
  mbedtls_chacha20_context ctx;
  mbedtls_chacha20_context local_b8;
  
  mbedtls_platform_zeroize(&local_b8,0x40);
  mbedtls_platform_zeroize(local_b8.keystream8,0x40);
  local_b8.keystream_bytes_used = 0x40;
  mbedtls_chacha20_setkey(&local_b8,key);
  mbedtls_chacha20_starts(&local_b8,nonce,counter);
  mbedtls_chacha20_update(&local_b8,data_len,input,output);
  mbedtls_platform_zeroize(&local_b8,0x88);
  return 0;
}

Assistant:

int mbedtls_chacha20_crypt( const unsigned char key[32],
                            const unsigned char nonce[12],
                            uint32_t counter,
                            size_t data_len,
                            const unsigned char* input,
                            unsigned char* output )
{
    mbedtls_chacha20_context ctx;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    CHACHA20_VALIDATE_RET( key != NULL );
    CHACHA20_VALIDATE_RET( nonce != NULL );
    CHACHA20_VALIDATE_RET( data_len == 0 || input  != NULL );
    CHACHA20_VALIDATE_RET( data_len == 0 || output != NULL );

    mbedtls_chacha20_init( &ctx );

    ret = mbedtls_chacha20_setkey( &ctx, key );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_chacha20_starts( &ctx, nonce, counter );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_chacha20_update( &ctx, data_len, input, output );

cleanup:
    mbedtls_chacha20_free( &ctx );
    return( ret );
}